

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Vector.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>_>::operator==
          (LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *this,
          LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *Value)

{
  KBOOL KVar1;
  KFIXED<short,_(unsigned_char)__x03_> local_60;
  KFIXED<short,_(unsigned_char)__x03_> local_50 [2];
  KFIXED<short,_(unsigned_char)__x03_> local_30;
  LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *local_20;
  LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *Value_local;
  LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)__x03_>_> *this_local;
  
  local_20 = Value;
  Value_local = this;
  KFIXED<short,_(unsigned_char)'\x03'>::KFIXED(&local_30,&Value->m_X);
  KVar1 = KFIXED<short,_(unsigned_char)'\x03'>::operator!=(&this->m_X,&local_30);
  KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_30);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KFIXED<short,_(unsigned_char)'\x03'>::KFIXED(local_50,&local_20->m_Y);
    KVar1 = KFIXED<short,_(unsigned_char)'\x03'>::operator!=(&this->m_Y,local_50);
    KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(local_50);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else {
      KFIXED<short,_(unsigned_char)'\x03'>::KFIXED(&local_60,&local_20->m_Z);
      KVar1 = KFIXED<short,_(unsigned_char)'\x03'>::operator!=(&this->m_Z,&local_60);
      KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_60);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL LE_Vector<Type>::operator == ( const LE_Vector & Value ) const
{
    if( m_X != Value.m_X ) return false;
    if( m_Y != Value.m_Y ) return false;
    if( m_Z != Value.m_Z ) return false;
    return true;
}